

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

int __thiscall tadsobj_sc_search_ctx::to_next(tadsobj_sc_search_ctx *this)

{
  vm_obj_id_t vVar1;
  vm_tadsobj_hdr *this_00;
  int iVar2;
  tadsobj_objid_and_ptr *ptVar3;
  
  ptVar3 = this->path_sc;
  do {
    if (ptVar3 != (tadsobj_objid_and_ptr *)0x0) {
      vVar1 = ptVar3->id;
      this->cur = vVar1;
      if (vVar1 == 0) {
LAB_002abdf7:
        iVar2 = 0;
      }
      else {
        this->curhdr = (vm_tadsobj_hdr *)(ptVar3->objp->super_CVmObject).ext_;
        this->path_sc = ptVar3 + 1;
LAB_002abe0c:
        iVar2 = 1;
      }
      return iVar2;
    }
    this_00 = this->curhdr;
    if (this_00->sc_cnt == 0) goto LAB_002abdf7;
    if (this_00->sc_cnt == 1) {
      this->cur = this_00->sc[0].id;
      this->curhdr = (vm_tadsobj_hdr *)((this_00->sc[0].objp)->super_CVmObject).ext_;
      goto LAB_002abe0c;
    }
    ptVar3 = vm_tadsobj_hdr::get_inh_search_path(this_00);
    this->path_sc = ptVar3;
  } while( true );
}

Assistant:

int to_next(VMG0_)
    {
        /* check for a path */
    try_again:
        if (path_sc == 0)
        {
            /* 
             *   we're not working on a path at all - this means we're
             *   working directly on a (so far) single-inheritance superclass
             *   chain, so simply follow the chain up to the next superclass 
             */

            /* we have no path, so look at our object's superclasses */
            switch(curhdr->sc_cnt)
            {
            case 1:
                /* we have exactly one superclass, so traverse to it */
                {
                    const vm_tadsobj_sc *sc = curhdr->sc;
                    cur = sc->id;
                    curhdr = sc->objp->get_hdr();
                }
                return TRUE;

            case 0:
                /* we have no superclasses, so there's nowhere to go */
                return FALSE;

            default:
                /* we have multiple superclasses, so set up a search path */
                path_sc = curhdr->get_inh_search_path(vmg0_);

                /* start over with the search path */
                goto try_again;
            }
        }
        else if ((cur = path_sc->id) != VM_INVALID_OBJ)
        {
            /*
             *   we're working on a path, and we have elements remaining -
             *   move on to the next element 
             */
            curhdr = path_sc->objp->get_hdr();
            ++path_sc;

            /* got it */
            return TRUE;
        }
        else
        {
            /* 
             *   we're working on a path, and we're out of elements - we have
             *   nowhere else to go 
             */
            return FALSE;
        }
    }